

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O2

void __thiscall
Qentem::BigInt<unsigned_long_long,_256U>::ShiftLeft
          (BigInt<unsigned_long_long,_256U> *this,SizeT32 offset)

{
  SizeT32 SVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar9 = (ulong)offset;
  if (0x3f < offset) {
    uVar5 = this->index_;
    uVar3 = offset >> 6;
    uVar8 = uVar5 + uVar3;
    if (3 < uVar8) {
      bVar10 = uVar5 < uVar8 - 3;
      uVar5 = uVar5 - (uVar8 - 3);
      if (bVar10) {
        Clear(this);
        return;
      }
      uVar8 = 3;
    }
    uVar4 = (ulong)uVar5;
    uVar9 = (ulong)(offset & 0x3f);
    uVar5 = uVar8;
    uVar6 = uVar4;
    while( true ) {
      uVar6 = uVar6 - 1;
      this->storage_[uVar5] = this->storage_[uVar4];
      if (uVar6 == 0xffffffffffffffff) break;
      SVar1 = ~uVar3 + uVar5;
      uVar5 = uVar5 - 1;
      this->index_ = SVar1;
      uVar4 = uVar6 & 0xffffffff;
    }
    memset(this,0,(ulong)(uVar3 - 1) * 8 + 8);
    do {
      uVar5 = uVar8;
      uVar8 = uVar5 - 1;
    } while (this->storage_[uVar5] == 0);
    this->index_ = uVar5;
  }
  if ((int)uVar9 != 0) {
    uVar8 = this->index_;
    uVar4 = (ulong)uVar8;
    uVar6 = this->storage_[uVar4];
    uVar7 = (ulong)(0x40 - (int)uVar9);
    this->storage_[uVar4] = uVar6 << (uVar9 & 0x3f);
    if (uVar4 != 3) {
      uVar6 = uVar6 >> (uVar7 & 0x3f);
      uVar8 = (uVar8 + 1) - (uint)(uVar6 == 0);
      this->index_ = uVar8;
      this->storage_[uVar8] = this->storage_[uVar8] | uVar6;
    }
    while (uVar6 = uVar4 - 1, uVar6 != 0xffffffffffffffff) {
      uVar2 = this->storage_[uVar6 & 0xffffffff];
      this->storage_[uVar4] = this->storage_[uVar4] | uVar2 >> (uVar7 & 0x3f);
      this->storage_[uVar6 & 0xffffffff] = uVar2 << (uVar9 & 0x3f);
      uVar4 = uVar6;
    }
  }
  return;
}

Assistant:

inline void ShiftLeft(SizeT32 offset) noexcept {
        if (offset >= TypeWidth()) {
            SizeT32 move = (offset / TypeWidth());
            offset -= (move * TypeWidth());

            SizeT32 index = index_;
            index += move;

            if (index > MaxIndex()) {
                const SizeT32 diff = (index - MaxIndex());

                if (diff <= index_) {
                    index_ -= diff;
                    index = MaxIndex();
                } else {
                    Clear();
                    return;
                }
            }

            storage_[index_ + move] = storage_[index_];

            while (index_ != 0U) {
                --index_;
                storage_[index_ + move] = storage_[index_];
            }

            do {
                --move;
                storage_[move] = 0;
            } while (move != 0U);

            while (storage_[index] == 0) {
                --index;
            }

            index_ = index;
        }

        if (offset != 0U) {
            SizeT32        index      = index_;
            const SizeT32  shift_size = (TypeWidth() - offset);
            const Number_T carry      = (storage_[index] >> shift_size);

            storage_[index] <<= offset;

            if (index_ != MaxIndex()) {
                index_ += SizeT32(carry != 0);
                storage_[index_] |= carry;
            }

            while (index != 0U) {
                storage_[index] |= (storage_[index - 1U] >> shift_size);
                --index;
                storage_[index] <<= offset;
            }
        }
    }